

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::LeastCommonMultipleFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  long lVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *function;
  pointer function_00;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbbc;
  FunctionNullHandling in_stack_fffffffffffffbc8;
  allocator_type local_431;
  undefined8 in_stack_fffffffffffffbd0;
  code *bind_lambda;
  scalar_function_t local_410;
  LogicalType local_3f0 [3];
  vector<duckdb::LogicalType,_true> local_3a8;
  LogicalType local_390;
  vector<duckdb::LogicalType,_true> local_378;
  LogicalType local_360;
  LogicalType local_348;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(local_3f0,BIGINT);
  LogicalType::LogicalType(local_3f0 + 1,BIGINT);
  __l._M_len = 2;
  __l._M_array = local_3f0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_378,__l,
             &local_431);
  LogicalType::LogicalType(&local_390,BIGINT);
  local_410.super__Function_base._M_functor._8_8_ = 0;
  local_410.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::BinaryFunction<long,long,long,duckdb::LeastCommonMultipleOperator>;
  local_410._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_410.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_348,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_348;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffbb4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffbbc;
  ScalarFunction::ScalarFunction
            (&local_208,&local_378,&local_390,&local_410,(bind_scalar_function_t)0x0,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffffbc8,
             (bind_lambda_function_t)in_stack_fffffffffffffbd0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_348);
  if (local_410.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_410.super__Function_base._M_manager)
              ((_Any_data *)&local_410,(_Any_data *)&local_410,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_390);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_378);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_3f0[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_3f0,HUGEINT);
  LogicalType::LogicalType(local_3f0 + 1,HUGEINT);
  __l_00._M_len = 2;
  __l_00._M_array = local_3f0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3a8,__l_00,
             &local_431);
  LogicalType::LogicalType(local_3f0 + 2,HUGEINT);
  bind_lambda = ScalarFunction::
                BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::LeastCommonMultipleOperator>
  ;
  LogicalType::LogicalType(&local_360,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_360;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffbb4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffbbc;
  ScalarFunction::ScalarFunction
            (&local_330,&local_3a8,local_3f0 + 2,(scalar_function_t *)&stack0xfffffffffffffbd0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffbc8,bind_lambda);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02432a00;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_360);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffbd0,(_Any_data *)&stack0xfffffffffffffbd0,
               __destroy_functor);
  LogicalType::~LogicalType(local_3f0 + 2);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_3a8);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_3f0[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
                _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function_00 != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function_00 = function_00 + 1;
    } while (function_00 != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet LeastCommonMultipleFun::GetFunctions() {
	ScalarFunctionSet funcs;

	funcs.AddFunction(
	    ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT}, LogicalType::BIGINT,
	                   ScalarFunction::BinaryFunction<int64_t, int64_t, int64_t, LeastCommonMultipleOperator>));
	funcs.AddFunction(
	    ScalarFunction({LogicalType::HUGEINT, LogicalType::HUGEINT}, LogicalType::HUGEINT,
	                   ScalarFunction::BinaryFunction<hugeint_t, hugeint_t, hugeint_t, LeastCommonMultipleOperator>));
	for (auto &function : funcs.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return funcs;
}